

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O1

void __thiscall EDPF::EDPF(EDPF *this,ED *obj)

{
  double dVar1;
  
  ED::ED(&this->super_ED,obj);
  dVar1 = (this->super_ED).sigma / 2.5;
  (this->super_ED).sigma = dVar1;
  cv::GaussianBlur(dVar1,0);
  validateEdgeSegments(this);
  return;
}

Assistant:

EDPF::EDPF(ED obj)
	:ED(obj)
{
	// Validate Edge Segments
	sigma /= 2.5;
	GaussianBlur(srcImage, smoothImage, Size(), sigma); // calculate kernel from sigma

	validateEdgeSegments();
}